

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_test.c
# Opt level: O1

MPP_RET test_ctx_deinit(MpiEncTestData *p)

{
  if (p != (MpiEncTestData *)0x0) {
    if (p->cam_ctx != (CamSource *)0x0) {
      camera_source_deinit(p->cam_ctx);
      p->cam_ctx = (CamSource *)0x0;
    }
    if ((FILE *)p->fp_input != (FILE *)0x0) {
      fclose((FILE *)p->fp_input);
      p->fp_input = (FILE *)0x0;
    }
    if ((FILE *)p->fp_output != (FILE *)0x0) {
      fclose((FILE *)p->fp_output);
      p->fp_output = (FILE *)0x0;
    }
    if ((FILE *)p->fp_verify != (FILE *)0x0) {
      fclose((FILE *)p->fp_verify);
      p->fp_verify = (FILE *)0x0;
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET test_ctx_deinit(MpiEncTestData *p)
{
    if (p) {
        if (p->cam_ctx) {
            camera_source_deinit(p->cam_ctx);
            p->cam_ctx = NULL;
        }
        if (p->fp_input) {
            fclose(p->fp_input);
            p->fp_input = NULL;
        }
        if (p->fp_output) {
            fclose(p->fp_output);
            p->fp_output = NULL;
        }
        if (p->fp_verify) {
            fclose(p->fp_verify);
            p->fp_verify = NULL;
        }
    }
    return MPP_OK;
}